

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O3

void __thiscall
pbrt::SurfaceInteraction::ComputeDifferentials
          (SurfaceInteraction *this,RayDifferential *ray,CameraHandle *camera,int samplesPerPixel)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  if (ray->hasDifferentials == true) {
    fVar34 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    fVar1 = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z;
    fVar2 = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    fVar3 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    fVar4 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    fVar5 = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
    auVar22 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar3),
                              ZEXT416((uint)(fVar34 * fVar1)));
    auVar20 = ZEXT416((uint)fVar34);
    auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar34 * fVar1)),auVar20,ZEXT416((uint)fVar1));
    auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ + auVar19._0_4_)),ZEXT416((uint)fVar4),
                              ZEXT416((uint)fVar5));
    if ((auVar22._0_4_ != 0.0) || (NAN(auVar22._0_4_))) {
      fVar6 = (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
      fVar7 = (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
      fVar8 = (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x;
      auVar19 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar3),
                                ZEXT416((uint)(fVar6 * fVar34)));
      auVar21 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * fVar34)),auVar20,ZEXT416((uint)fVar6));
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ + auVar21._0_4_)),ZEXT416((uint)fVar4),
                                ZEXT416((uint)fVar8));
      fVar37 = auVar19._0_4_;
      if ((fVar37 != 0.0) || (NAN(fVar37))) {
        auVar38 = ZEXT416((uint)(ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y);
        fVar14 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
                 (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) * 0.5;
        fVar15 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
                 (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5;
        fVar16 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                 (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
        auVar23 = ZEXT416((uint)fVar3);
        auVar19 = vfmadd213ss_fma(ZEXT416((uint)fVar15),auVar23,ZEXT416((uint)(fVar16 * fVar34)));
        auVar21 = vfmsub231ss_fma(ZEXT416((uint)(fVar16 * fVar34)),auVar20,ZEXT416((uint)fVar16));
        auVar19 = vaddss_avx512f(auVar19,auVar21);
        fVar3 = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
        auVar24 = ZEXT416((uint)fVar4);
        auVar19 = vfmadd231ss_avx512f(auVar19,auVar24,ZEXT416((uint)fVar14));
        auVar20 = vmulss_avx512f(auVar20,ZEXT416((uint)fVar3));
        auVar21 = vfmadd213ss_avx512f(auVar38,auVar23,auVar20);
        auVar30 = ZEXT416((uint)fVar34);
        auVar20 = vfmsub231ss_avx512f(auVar20,auVar30,ZEXT416((uint)fVar3));
        auVar20 = vaddss_avx512f(auVar21,auVar20);
        auVar21 = ZEXT416((uint)(ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x);
        auVar20 = vfmadd231ss_avx512f(auVar20,auVar24,auVar21);
        auVar20 = vsubss_avx512f(auVar19,auVar20);
        auVar22 = vdivss_avx512f(auVar20,auVar22);
        fVar34 = auVar22._0_4_;
        if (0x7f7fffff < (uint)ABS(fVar34)) {
          LogFatal<char_const(&)[25]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/interaction.cpp"
                     ,0x32,"Check failed: %s",(char (*) [25])"!IsInf(tx) && !IsNaN(tx)");
        }
        fVar4 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z;
        auVar20 = vmulss_avx512f(auVar30,ZEXT416((uint)fVar4));
        auVar39 = ZEXT416((uint)(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y);
        auVar23 = vfmadd213ss_avx512f(auVar23,auVar39,auVar20);
        auVar20 = vfmsub213ss_avx512f(auVar30,ZEXT416((uint)fVar4),auVar20);
        auVar30 = ZEXT416((uint)(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x);
        auVar20 = vfmadd213ss_avx512f(auVar24,auVar30,ZEXT416((uint)(auVar23._0_4_ + auVar20._0_4_))
                                     );
        auVar19 = vsubss_avx512f(auVar19,auVar20);
        auVar20._0_4_ = auVar19._0_4_ / fVar37;
        auVar20._4_12_ = auVar19._4_12_;
        if (0x7f7fffff < (uint)ABS(auVar20._0_4_)) {
          LogFatal<char_const(&)[25]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/interaction.cpp"
                     ,0x35,"Check failed: %s",(char (*) [25])"!IsInf(ty) && !IsNaN(ty)");
        }
        auVar19 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar6),0x10);
        auVar22 = vinsertps_avx(auVar22,auVar20,0x10);
        auVar24 = vaddss_avx512f(auVar38,ZEXT416((uint)(fVar34 * fVar2)));
        auVar23 = vaddss_avx512f(auVar39,ZEXT416((uint)(fVar7 * auVar20._0_4_)));
        auVar20 = vinsertps_avx(ZEXT416((uint)(fVar34 * fVar5)),
                                ZEXT416((uint)(fVar8 * auVar20._0_4_)),0x10);
        auVar24 = vinsertps_avx(auVar24,auVar23,0x10);
        auVar21 = vinsertps_avx512f(auVar21,auVar30,0x10);
        auVar23._0_4_ = auVar21._0_4_ + auVar20._0_4_;
        auVar23._4_4_ = auVar21._4_4_ + auVar20._4_4_;
        auVar23._8_4_ = auVar21._8_4_ + auVar20._8_4_;
        auVar23._12_4_ = auVar21._12_4_ + auVar20._12_4_;
        auVar20 = vinsertps_avx512f(ZEXT416((uint)fVar3),ZEXT416((uint)fVar4),0x10);
        auVar21._0_4_ = auVar20._0_4_ + auVar19._0_4_ * auVar22._0_4_;
        auVar21._4_4_ = auVar20._4_4_ + auVar19._4_4_ * auVar22._4_4_;
        auVar21._8_4_ = auVar20._8_4_ + auVar19._8_4_ * auVar22._8_4_;
        auVar21._12_4_ = auVar20._12_4_ + auVar19._12_4_ * auVar22._12_4_;
        auVar19._4_4_ = fVar14;
        auVar19._0_4_ = fVar14;
        auVar19._8_4_ = fVar14;
        auVar19._12_4_ = fVar14;
        auVar22 = vsubps_avx(auVar23,auVar19);
        auVar30._4_4_ = fVar15;
        auVar30._0_4_ = fVar15;
        auVar30._8_4_ = fVar15;
        auVar30._12_4_ = fVar15;
        auVar20 = vsubps_avx(auVar24,auVar30);
        auVar19 = vunpcklps_avx(auVar22,auVar20);
        uVar9 = vmovlps_avx(auVar19);
        (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar9;
        (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar9 >> 0x20);
        auVar24._4_4_ = fVar16;
        auVar24._0_4_ = fVar16;
        auVar24._8_4_ = fVar16;
        auVar24._12_4_ = fVar16;
        auVar19 = vsubps_avx(auVar21,auVar24);
        auVar21 = vinsertps_avx(auVar20,auVar22,0x4c);
        (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z = auVar19._0_4_;
        uVar9 = vmovlps_avx(auVar21);
        (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar9;
        (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar9 >> 0x20);
        fVar34 = (float)vextractps_avx(auVar19,1);
        (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z = fVar34;
        goto LAB_004d80cf;
      }
    }
  }
  CameraHandle::ApproximatedPdxy(camera,this,samplesPerPixel);
  auVar22._0_12_ = *(undefined1 (*) [12])&this->dpdx;
  auVar22._12_4_ = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar19 = vinsertps_avx(*(undefined1 (*) [16])&(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z,
                          ZEXT416((uint)(this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z),0x10);
  auVar22 = vinsertps_avx(auVar22,ZEXT416((uint)(this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x),
                          0x10);
  auVar20 = vinsertps_avx(*(undefined1 (*) [16])&(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y,
                          ZEXT416((uint)(this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y),0x10);
LAB_004d80cf:
  fVar34 = (this->dpdu).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar1 = (this->dpdv).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar20 = vshufps_avx(auVar20,auVar20,0x50);
  auVar21 = vshufps_avx(auVar22,auVar22,0x50);
  auVar19 = vshufps_avx(auVar19,auVar19,0x50);
  auVar22 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar34),0x10);
  fVar2 = auVar22._0_4_;
  auVar35._0_4_ = fVar2 * fVar2;
  fVar3 = auVar22._4_4_;
  auVar35._4_4_ = fVar3 * fVar3;
  auVar35._8_4_ = auVar22._8_4_ * auVar22._8_4_;
  auVar35._12_4_ = auVar22._12_4_ * auVar22._12_4_;
  auVar22 = ZEXT416((uint)(this->dpdu).super_Tuple3<pbrt::Vector3,_float>.x);
  auVar24 = ZEXT416((uint)(this->dpdv).super_Tuple3<pbrt::Vector3,_float>.x);
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar1)),auVar22,auVar24);
  auVar22 = vinsertps_avx(auVar24,auVar22,0x10);
  auVar28._0_4_ = fVar2 * auVar20._0_4_;
  auVar28._4_4_ = fVar3 * auVar20._4_4_;
  auVar28._8_4_ = fVar2 * auVar20._8_4_;
  auVar28._12_4_ = fVar3 * auVar20._12_4_;
  auVar24 = vfmadd231ps_fma(auVar35,auVar22,auVar22);
  auVar31._0_8_ = auVar22._0_8_;
  auVar31._8_8_ = auVar31._0_8_;
  auVar20 = vfmadd213ps_fma(auVar31,auVar21,auVar28);
  auVar22 = ZEXT416((uint)(this->dpdu).super_Tuple3<pbrt::Vector3,_float>.z);
  auVar21 = ZEXT416((uint)(this->dpdv).super_Tuple3<pbrt::Vector3,_float>.z);
  auVar23 = vfmadd231ss_fma(auVar23,auVar22,auVar21);
  auVar22 = vinsertps_avx(auVar21,auVar22,0x10);
  auVar21 = vfmadd231ps_fma(auVar24,auVar22,auVar22);
  auVar27._8_8_ = auVar22._0_8_;
  auVar27._0_8_ = auVar22._0_8_;
  auVar20 = vfmadd213ps_fma(auVar27,auVar19,auVar20);
  fVar34 = auVar23._0_4_;
  auVar36._4_4_ = fVar34;
  auVar36._0_4_ = fVar34;
  auVar36._8_4_ = fVar34;
  auVar36._12_4_ = fVar34;
  auVar22 = vmovshdup_avx(auVar21);
  auVar19 = vshufps_avx(auVar21,auVar21,0x11);
  auVar24 = vfnmadd213ss_fma(auVar23,auVar23,ZEXT416((uint)(fVar34 * fVar34)));
  auVar21 = vfmsub213ss_fma(auVar22,auVar21,ZEXT416((uint)(fVar34 * fVar34)));
  auVar22 = vshufps_avx(auVar20,auVar20,0xb1);
  auVar32._0_4_ = fVar34 * auVar22._0_4_;
  auVar32._4_4_ = fVar34 * auVar22._4_4_;
  auVar32._8_4_ = fVar34 * auVar22._8_4_;
  auVar32._12_4_ = fVar34 * auVar22._12_4_;
  auVar19 = vfmsub213ps_fma(auVar20,auVar19,auVar32);
  auVar22 = vfnmadd213ps_fma(auVar22,auVar36,auVar32);
  auVar33._8_4_ = 0xccbebc20;
  auVar33._0_8_ = 0xccbebc20ccbebc20;
  auVar33._12_4_ = 0xccbebc20;
  auVar29._8_4_ = 0x4cbebc20;
  auVar29._0_8_ = 0x4cbebc204cbebc20;
  auVar29._12_4_ = 0x4cbebc20;
  fVar34 = 1.0 / (auVar21._0_4_ + auVar24._0_4_);
  fVar34 = (float)((uint)((uint)ABS(fVar34) < 0x7f800000) * (int)fVar34);
  auVar26._0_4_ = (auVar19._0_4_ + auVar22._0_4_) * fVar34;
  auVar26._4_4_ = (auVar19._4_4_ + auVar22._4_4_) * fVar34;
  auVar26._8_4_ = (auVar19._8_4_ + auVar22._8_4_) * fVar34;
  auVar26._12_4_ = (auVar19._12_4_ + auVar22._12_4_) * fVar34;
  auVar38._8_4_ = 0x7fffffff;
  auVar38._0_8_ = 0x7fffffff7fffffff;
  auVar38._12_4_ = 0x7fffffff;
  auVar22 = vandps_avx512vl(auVar26,auVar38);
  auVar39._8_4_ = 0x7f800000;
  auVar39._0_8_ = 0x7f8000007f800000;
  auVar39._12_4_ = 0x7f800000;
  uVar18 = vpcmpd_avx512vl(auVar22,auVar39,1);
  uVar18 = uVar18 & 0xf;
  uVar17 = vcmpps_avx512vl(auVar26,auVar33,1);
  auVar22 = vminps_avx(auVar29,auVar26);
  bVar10 = (bool)((byte)uVar17 & 1);
  bVar11 = (bool)((byte)(uVar17 >> 1) & 1);
  bVar12 = (bool)((byte)(uVar17 >> 2) & 1);
  bVar13 = (bool)((byte)(uVar17 >> 3) & 1);
  auVar25._4_4_ =
       (uint)((byte)(uVar18 >> 1) & 1) *
       ((uint)bVar11 * -0x334143e0 | (uint)!bVar11 * auVar22._4_4_);
  auVar25._0_4_ =
       (uint)((byte)uVar18 & 1) * ((uint)bVar10 * -0x334143e0 | (uint)!bVar10 * auVar22._0_4_);
  auVar25._8_4_ =
       (uint)((byte)(uVar18 >> 2) & 1) *
       ((uint)bVar12 * -0x334143e0 | (uint)!bVar12 * auVar22._8_4_);
  auVar25._12_4_ =
       (uint)(byte)(uVar18 >> 3) * ((uint)bVar13 * -0x334143e0 | (uint)!bVar13 * auVar22._12_4_);
  auVar22 = vshufps_avx(auVar25,auVar25,0xb1);
  this->dudx = (Float)auVar22._0_4_;
  this->dvdx = (Float)auVar22._4_4_;
  this->dudy = (Float)auVar22._8_4_;
  this->dvdy = (Float)auVar22._12_4_;
  return;
}

Assistant:

void SurfaceInteraction::ComputeDifferentials(const RayDifferential &ray,
                                              CameraHandle camera, int samplesPerPixel) {
    if (ray.hasDifferentials && Dot(n, ray.rxDirection) != 0 &&
        Dot(n, ray.ryDirection) != 0) {
        // Estimate screen-space change in $\pt{}$
        // Compute auxiliary intersection points with plane, _px_ and _py_
        Float d = -Dot(n, Vector3f(p()));
        Float tx = (-Dot(n, Vector3f(ray.rxOrigin)) - d) / Dot(n, ray.rxDirection);
        CHECK(!IsInf(tx) && !IsNaN(tx));
        Point3f px = ray.rxOrigin + tx * ray.rxDirection;
        Float ty = (-Dot(n, Vector3f(ray.ryOrigin)) - d) / Dot(n, ray.ryDirection);
        CHECK(!IsInf(ty) && !IsNaN(ty));
        Point3f py = ray.ryOrigin + ty * ray.ryDirection;

        dpdx = px - p();
        dpdy = py - p();

    } else
        camera.ApproximatedPdxy(*this, samplesPerPixel);
    // Estimate screen-space change in $(u,v)$
    Float a00 = Dot(dpdu, dpdu), a01 = Dot(dpdu, dpdv), a11 = Dot(dpdv, dpdv);
    Float invDet = 1 / (DifferenceOfProducts(a00, a11, a01, a01));

    Float b0x = Dot(dpdu, dpdx), b1x = Dot(dpdv, dpdx);
    Float b0y = Dot(dpdu, dpdy), b1y = Dot(dpdv, dpdy);

    /* Set the UV partials to zero if dpdu and/or dpdv == 0 */
    invDet = std::isfinite(invDet) ? invDet : 0.f;

    dudx = DifferenceOfProducts(a11, b0x, a01, b1x) * invDet;
    dvdx = DifferenceOfProducts(a00, b1x, a01, b0x) * invDet;

    dudy = DifferenceOfProducts(a11, b0y, a01, b1y) * invDet;
    dvdy = DifferenceOfProducts(a00, b1y, a01, b0y) * invDet;

    dudx = std::isfinite(dudx) ? Clamp(dudx, -1e8f, 1e8f) : 0.f;
    dvdx = std::isfinite(dvdx) ? Clamp(dvdx, -1e8f, 1e8f) : 0.f;
    dudy = std::isfinite(dudy) ? Clamp(dudy, -1e8f, 1e8f) : 0.f;
    dvdy = std::isfinite(dvdy) ? Clamp(dvdy, -1e8f, 1e8f) : 0.f;
}